

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

void __thiscall irr::core::string<char>::reallocate(string<char> *this,s32 new_size)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  
  pcVar1 = this->array;
  pcVar3 = (char *)operator_new__((long)new_size);
  this->array = pcVar3;
  this->allocated = new_size;
  uVar2 = this->used;
  uVar5 = new_size;
  if ((int)uVar2 < new_size) {
    uVar5 = uVar2;
  }
  if (0 < (int)uVar5) {
    uVar4 = 0;
    do {
      this->array[uVar4] = pcVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    new_size = this->allocated;
    uVar2 = this->used;
  }
  if (new_size < (int)uVar2) {
    this->used = new_size;
  }
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
    return;
  }
  return;
}

Assistant:

void reallocate(s32 new_size)
	{
		T* old_array = array;

		array = new T[new_size];
		allocated = new_size;
		
		s32 amount = used < new_size ? used : new_size;
		for (s32 i=0; i<amount; ++i)
			array[i] = old_array[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_array;
	}